

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O2

int coda_mem_cursor_get_string_length(coda_cursor *cursor,long *length)

{
  int iVar1;
  ulong uVar2;
  int64_t bit_size;
  
  iVar1 = coda_mem_cursor_get_bit_size(cursor,&bit_size);
  if (iVar1 == 0) {
    uVar2 = 0xffffffffffffffff;
    if (-1 < bit_size) {
      uVar2 = (ulong)bit_size >> 3;
    }
    *length = uVar2;
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int coda_mem_cursor_get_string_length(const coda_cursor *cursor, long *length)
{
    int64_t bit_size;

    if (coda_mem_cursor_get_bit_size(cursor, &bit_size) != 0)
    {
        return -1;
    }
    if (bit_size < 0)
    {
        *length = -1;
    }
    else
    {
        *length = (long)(bit_size >> 3);
    }

    return 0;
}